

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assign_inliner.cpp
# Opt level: O0

unique_ptr<verilogAST::Port,_std::default_delete<verilogAST::Port>_> __thiscall
verilogAST::AssignMapBuilder::visit
          (AssignMapBuilder *this,
          unique_ptr<verilogAST::Port,_std::default_delete<verilogAST::Port>_> *node)

{
  pointer pPVar1;
  unique_ptr<verilogAST::Port,_std::default_delete<verilogAST::Port>_> *in_RDX;
  anon_class_1_0_00000001 local_41;
  undefined1 local_40 [8];
  string port_str;
  unique_ptr<verilogAST::Port,_std::default_delete<verilogAST::Port>_> *node_local;
  AssignMapBuilder *this_local;
  
  pPVar1 = std::unique_ptr<verilogAST::Port,_std::default_delete<verilogAST::Port>_>::operator->
                     (in_RDX);
  std::
  visit_abi_cxx11_<verilogAST::AssignMapBuilder::visit(std::unique_ptr<verilogAST::Port,std::default_delete<verilogAST::Port>>)::__0,std::variant<std::unique_ptr<verilogAST::Identifier,std::default_delete<verilogAST::Identifier>>,std::unique_ptr<verilogAST::Vector,std::default_delete<verilogAST::Vector>>>&>
            ((__visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_leonardt[P]verilogAST_cpp_src_assign_inliner_cpp:107:7),_std::variant<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>_&>
              *)local_40,&local_41,&pPVar1->value);
  pPVar1 = std::unique_ptr<verilogAST::Port,_std::default_delete<verilogAST::Port>_>::operator->
                     (in_RDX);
  if (pPVar1->direction == INPUT) {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)node[5]._M_t.
                super___uniq_ptr_impl<verilogAST::Port,_std::default_delete<verilogAST::Port>_>._M_t
                .super__Tuple_impl<0UL,_verilogAST::Port_*,_std::default_delete<verilogAST::Port>_>.
                super__Head_base<0UL,_verilogAST::Port_*,_false>._M_head_impl,(value_type *)local_40
            );
  }
  else {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)node[3]._M_t.
                super___uniq_ptr_impl<verilogAST::Port,_std::default_delete<verilogAST::Port>_>._M_t
                .super__Tuple_impl<0UL,_verilogAST::Port_*,_std::default_delete<verilogAST::Port>_>.
                super__Head_base<0UL,_verilogAST::Port_*,_false>._M_head_impl,(value_type *)local_40
            );
    pPVar1 = std::unique_ptr<verilogAST::Port,_std::default_delete<verilogAST::Port>_>::operator->
                       (in_RDX);
    if (pPVar1->direction == OUTPUT) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)node[4]._M_t.
                  super___uniq_ptr_impl<verilogAST::Port,_std::default_delete<verilogAST::Port>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_verilogAST::Port_*,_std::default_delete<verilogAST::Port>_>
                  .super__Head_base<0UL,_verilogAST::Port_*,_false>._M_head_impl,
               (value_type *)local_40);
    }
  }
  std::unique_ptr<verilogAST::Port,_std::default_delete<verilogAST::Port>_>::unique_ptr
            ((unique_ptr<verilogAST::Port,_std::default_delete<verilogAST::Port>_> *)this,in_RDX);
  std::__cxx11::string::~string((string *)local_40);
  return (__uniq_ptr_data<verilogAST::Port,_std::default_delete<verilogAST::Port>,_true,_true>)
         (__uniq_ptr_data<verilogAST::Port,_std::default_delete<verilogAST::Port>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Port> AssignMapBuilder::visit(std::unique_ptr<Port> node) {
  std::string port_str = std::visit(
      [](auto&& value) -> std::string {
        if (auto ptr = dynamic_cast<Identifier*>(value.get())) {
          return ptr->toString();
        } else if (auto ptr = dynamic_cast<Vector*>(value.get())) {
          return ptr->id->toString();
        }
        throw std::runtime_error("Unreachable");  // LCOV_EXCL_LINE
        return "";                                // LCOV_EXCL_LINE
      },
      node->value);
  if (node->direction != Direction::INPUT) {
    this->non_input_ports.insert(port_str);
    if (node->direction == Direction::OUTPUT) {
      this->output_ports.insert(port_str);
    }
  } else {
    this->input_ports.insert(port_str);
  }
  return node;
}